

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_compute_color_stats
               (LodePNGColorStats *stats,uchar *in,uint w,uint h,LodePNGColorMode *mode_in)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  uint in_ECX;
  uint in_EDX;
  uchar *in_RSI;
  int *in_RDI;
  LodePNGColorMode *in_R8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  uint n;
  uchar *p;
  uint matchkey_1;
  uint bits;
  uchar pa;
  uchar pb;
  uchar pg;
  uchar pr;
  uchar a_2;
  uchar b_2;
  uchar g_2;
  uchar r_2;
  uint matchkey;
  unsigned_short a_1;
  unsigned_short b_1;
  unsigned_short g_1;
  unsigned_short r_1;
  unsigned_short a;
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  uchar *color;
  uint maxnumcolors;
  uint sixteen;
  uint bits_done;
  uint bpp;
  uint numcolors_done;
  uint alpha_done;
  uint colored_done;
  uint error;
  size_t numpixels;
  ColorTree tree;
  size_t i;
  LodePNGColorMode *pLVar12;
  uint in_stack_fffffffffffffed0;
  uchar in_stack_fffffffffffffed4;
  uchar in_stack_fffffffffffffed5;
  uchar in_stack_fffffffffffffed6;
  uchar in_stack_fffffffffffffed7;
  undefined6 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffede;
  undefined1 in_stack_fffffffffffffedf;
  uint local_120;
  uint in_stack_fffffffffffffee8;
  uint uVar14;
  int in_stack_fffffffffffffeec;
  int *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  uint in_stack_fffffffffffffefc;
  uint in_stack_ffffffffffffff00;
  char cVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  char cVar19;
  char cVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte value;
  byte bVar25;
  undefined4 in_stack_ffffffffffffff0c;
  unsigned_short in_stack_ffffffffffffff10;
  unsigned_short uVar26;
  unsigned_short in_stack_ffffffffffffff12;
  unsigned_short uVar27;
  unsigned_short in_stack_ffffffffffffff14;
  unsigned_short uVar28;
  unsigned_short in_stack_ffffffffffffff16;
  unsigned_short uVar29;
  unsigned_short local_e8;
  unsigned_short local_e6;
  unsigned_short local_e4;
  unsigned_short local_e2;
  LodePNGColorMode *in_stack_ffffffffffffff20;
  uint local_d8;
  uint local_bc;
  ulong local_28;
  undefined4 uVar13;
  
  sVar8 = (ulong)in_EDX * (ulong)in_ECX;
  local_bc = 0;
  uVar4 = lodepng_is_greyscale_type(in_R8);
  uVar5 = lodepng_can_have_alpha
                    ((LodePNGColorMode *)
                     CONCAT17(in_stack_fffffffffffffed7,
                              CONCAT16(in_stack_fffffffffffffed6,
                                       CONCAT15(in_stack_fffffffffffffed5,
                                                CONCAT14(in_stack_fffffffffffffed4,
                                                         in_stack_fffffffffffffed0)))));
  uVar6 = lodepng_get_bpp((LodePNGColorMode *)0x1c34e4);
  uVar14 = in_stack_fffffffffffffee8 & 0xffffff;
  if (in_RDI[0x106] == 1) {
    uVar14 = CONCAT13(uVar6 == 1,(int3)in_stack_fffffffffffffee8);
  }
  uVar3 = uVar14 >> 0x18;
  bVar11 = false;
  local_d8 = 0x101;
  if (uVar6 < 9) {
    if ((uint)(in_RDI[5] + (1 << ((byte)uVar6 & 0x1f))) < 0x102) {
      local_120 = in_RDI[5] + (1 << ((byte)uVar6 & 0x1f));
    }
    else {
      local_120 = 0x101;
    }
    local_d8 = local_120;
  }
  *(size_t *)(in_RDI + 0x108) = sVar8 + *(long *)(in_RDI + 0x108);
  iVar7 = in_RDI[0x10a];
  color_tree_init((ColorTree *)0x1c35d5);
  bVar2 = in_RDI[4] != 0 || uVar5 == 0;
  bVar1 = *in_RDI != 0 || uVar4 != 0;
  bVar9 = uVar6 <= (uint)in_RDI[0x106] || (char)uVar3 != '\0';
  bVar10 = local_d8 <= (uint)in_RDI[5] || (in_RDI[0x106] == 0x10 || iVar7 == 0);
  if (local_d8 > (uint)in_RDI[5] && (in_RDI[0x106] != 0x10 && iVar7 != 0)) {
    for (local_28 = 0; local_28 < (uint)in_RDI[5]; local_28 = local_28 + 1) {
      in_stack_ffffffffffffff20 = (LodePNGColorMode *)(in_RDI + local_28 + 6);
      local_bc = color_tree_add((ColorTree *)
                                CONCAT17(in_stack_fffffffffffffedf,
                                         CONCAT16(in_stack_fffffffffffffede,
                                                  in_stack_fffffffffffffed8)),
                                in_stack_fffffffffffffed7,in_stack_fffffffffffffed6,
                                in_stack_fffffffffffffed5,in_stack_fffffffffffffed4,
                                in_stack_fffffffffffffed0);
      if (local_bc != 0) goto LAB_001c425a;
    }
  }
  if (in_R8->bitdepth == 0x10) {
    local_e2 = 0;
    local_e4 = 0;
    local_e6 = 0;
    local_e8 = 0;
    for (local_28 = 0; local_28 != sVar8; local_28 = local_28 + 1) {
      getPixelColorRGBA16(&local_e2,&local_e4,&local_e6,&local_e8,in_RSI,local_28,in_R8);
      if (((((local_e2 & 0xff) != (int)(uint)local_e2 >> 8) ||
           ((local_e4 & 0xff) != (int)(uint)local_e4 >> 8)) ||
          ((local_e6 & 0xff) != (int)(uint)local_e6 >> 8)) ||
         ((local_e8 & 0xff) != (int)(uint)local_e8 >> 8)) {
        in_RDI[0x106] = 0x10;
        bVar11 = true;
        bVar9 = true;
        bVar10 = true;
        break;
      }
    }
  }
  if (bVar11) {
    uVar29 = 0;
    uVar28 = 0;
    uVar27 = 0;
    uVar26 = 0;
    for (local_28 = 0; local_28 != sVar8; local_28 = local_28 + 1) {
      getPixelColorRGBA16((unsigned_short *)&stack0xffffffffffffff16,
                          (unsigned_short *)&stack0xffffffffffffff14,
                          (unsigned_short *)&stack0xffffffffffffff12,
                          (unsigned_short *)&stack0xffffffffffffff10,in_RSI,local_28,in_R8);
      if ((!bVar1) && ((uVar29 != uVar28 || (uVar29 != uVar27)))) {
        *in_RDI = 1;
        bVar1 = true;
      }
      if (!bVar2) {
        bVar11 = false;
        if ((uVar29 == *(unsigned_short *)(in_RDI + 2)) &&
           (bVar11 = false, uVar28 == *(unsigned_short *)((long)in_RDI + 10))) {
          bVar11 = uVar27 == *(unsigned_short *)(in_RDI + 3);
        }
        if ((uVar26 == 0xffff) || ((uVar26 == 0 && ((in_RDI[1] == 0 || (bVar11)))))) {
          if ((uVar26 == 0) && ((in_RDI[4] == 0 && (in_RDI[1] == 0)))) {
            in_RDI[1] = 1;
            *(unsigned_short *)(in_RDI + 2) = uVar29;
            *(unsigned_short *)((long)in_RDI + 10) = uVar28;
            *(unsigned_short *)(in_RDI + 3) = uVar27;
          }
          else if ((uVar26 == 0xffff) && ((in_RDI[1] != 0 && (bVar11)))) {
            in_RDI[4] = 1;
            in_RDI[1] = 0;
            bVar2 = true;
          }
        }
        else {
          in_RDI[4] = 1;
          in_RDI[1] = 0;
          bVar2 = true;
        }
      }
      if ((((bVar2) && (bVar10)) && (bVar1)) && (bVar9)) break;
    }
    if ((in_RDI[1] != 0) && (in_RDI[4] == 0)) {
      for (local_28 = 0; local_28 != sVar8; local_28 = local_28 + 1) {
        getPixelColorRGBA16((unsigned_short *)&stack0xffffffffffffff16,
                            (unsigned_short *)&stack0xffffffffffffff14,
                            (unsigned_short *)&stack0xffffffffffffff12,
                            (unsigned_short *)&stack0xffffffffffffff10,in_RSI,local_28,in_R8);
        if (((uVar26 != 0) && (uVar29 == *(unsigned_short *)(in_RDI + 2))) &&
           ((uVar28 == *(unsigned_short *)((long)in_RDI + 10) &&
            (uVar27 == *(unsigned_short *)(in_RDI + 3))))) {
          in_RDI[4] = 1;
          in_RDI[1] = 0;
        }
      }
    }
  }
  else {
    value = 0;
    bVar23 = 0;
    bVar21 = 0;
    cVar19 = '\0';
    bVar18 = 0;
    bVar17 = 0;
    bVar16 = 0;
    cVar15 = '\0';
    for (local_28 = 0; local_28 != sVar8; local_28 = local_28 + 1) {
      pLVar12 = in_R8;
      getPixelColorRGBA8((uchar *)CONCAT26(in_stack_ffffffffffffff16,
                                           CONCAT24(in_stack_ffffffffffffff14,
                                                    CONCAT22(in_stack_ffffffffffffff12,
                                                             in_stack_ffffffffffffff10))),
                         (uchar *)CONCAT44(in_stack_ffffffffffffff0c,
                                           CONCAT13(value,CONCAT12(bVar23,CONCAT11(bVar21,cVar19))))
                         ,(uchar *)CONCAT17(bVar18,CONCAT16(bVar17,CONCAT15(bVar16,CONCAT14(cVar15,
                                                  in_stack_ffffffffffffff00)))),
                         (uchar *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                         (uchar *)in_stack_fffffffffffffef0,
                         CONCAT44(in_stack_fffffffffffffeec,uVar14),in_stack_ffffffffffffff20);
      uVar13 = (undefined4)((ulong)pLVar12 >> 0x20);
      if (((local_28 == 0) || (value != bVar18)) ||
         ((bVar23 != bVar17 || ((bVar21 != bVar16 || (cVar19 != cVar15)))))) {
        cVar15 = cVar19;
        bVar16 = bVar21;
        bVar17 = bVar23;
        bVar18 = value;
        cVar20 = cVar19;
        bVar22 = bVar21;
        bVar24 = bVar23;
        bVar25 = value;
        if ((!bVar9) &&
           (((uint)in_RDI[0x106] < 8 &&
            (in_stack_ffffffffffffff00 = getValueRequiredBits(value), cVar15 = cVar19,
            bVar16 = bVar21, bVar17 = bVar23, bVar18 = value,
            (uint)in_RDI[0x106] < in_stack_ffffffffffffff00)))) {
          in_RDI[0x106] = in_stack_ffffffffffffff00;
        }
        value = bVar25;
        bVar23 = bVar24;
        bVar21 = bVar22;
        cVar19 = cVar20;
        bVar9 = uVar6 <= (uint)in_RDI[0x106];
        if ((!bVar1) && ((value != bVar23 || (value != bVar21)))) {
          *in_RDI = 1;
          bVar1 = true;
          if ((uint)in_RDI[0x106] < 8) {
            in_RDI[0x106] = 8;
          }
        }
        if (!bVar2) {
          in_stack_fffffffffffffede = false;
          if (((ushort)value == *(ushort *)(in_RDI + 2)) &&
             (in_stack_fffffffffffffede = false, (ushort)bVar23 == *(ushort *)((long)in_RDI + 10)))
          {
            in_stack_fffffffffffffede = (ushort)bVar21 == *(ushort *)(in_RDI + 3);
          }
          in_stack_fffffffffffffefc = (uint)(byte)in_stack_fffffffffffffede;
          if ((cVar19 == -1) ||
             ((cVar19 == '\0' && ((in_RDI[1] == 0 || (in_stack_fffffffffffffefc != 0)))))) {
            if ((cVar19 == '\0') && ((in_RDI[4] == 0 && (in_RDI[1] == 0)))) {
              in_RDI[1] = 1;
              *(ushort *)(in_RDI + 2) = (ushort)value;
              *(ushort *)((long)in_RDI + 10) = (ushort)bVar23;
              *(ushort *)(in_RDI + 3) = (ushort)bVar21;
            }
            else if ((cVar19 == -1) && ((in_RDI[1] != 0 && (in_stack_fffffffffffffefc != 0)))) {
              in_RDI[4] = 1;
              in_RDI[1] = 0;
              bVar2 = true;
              if ((uint)in_RDI[0x106] < 8) {
                in_RDI[0x106] = 8;
              }
            }
          }
          else {
            in_RDI[4] = 1;
            in_RDI[1] = 0;
            bVar2 = true;
            if ((uint)in_RDI[0x106] < 8) {
              in_RDI[0x106] = 8;
            }
          }
        }
        if ((!bVar10) &&
           (iVar7 = color_tree_has((ColorTree *)
                                   CONCAT17(in_stack_fffffffffffffed7,
                                            CONCAT16(in_stack_fffffffffffffed6,
                                                     CONCAT15(in_stack_fffffffffffffed5,
                                                              CONCAT14(in_stack_fffffffffffffed4,
                                                                       in_stack_fffffffffffffed0))))
                                   ,(uchar)((uint)uVar13 >> 0x18),(uchar)((uint)uVar13 >> 0x10),
                                   (uchar)((uint)uVar13 >> 8),(uchar)uVar13), iVar7 == 0)) {
          local_bc = color_tree_add((ColorTree *)
                                    CONCAT17(in_stack_fffffffffffffedf,
                                             CONCAT16(in_stack_fffffffffffffede,
                                                      in_stack_fffffffffffffed8)),
                                    in_stack_fffffffffffffed7,in_stack_fffffffffffffed6,
                                    in_stack_fffffffffffffed5,in_stack_fffffffffffffed4,
                                    in_stack_fffffffffffffed0);
          if (local_bc != 0) goto LAB_001c425a;
          if ((uint)in_RDI[5] < 0x100) {
            in_stack_fffffffffffffef0 = in_RDI + 6;
            in_stack_fffffffffffffeec = in_RDI[5];
            *(byte *)((long)in_stack_fffffffffffffef0 +
                     (ulong)(uint)(in_stack_fffffffffffffeec << 2)) = value;
            *(byte *)((long)in_stack_fffffffffffffef0 + (ulong)(in_stack_fffffffffffffeec * 4 + 1))
                 = bVar23;
            *(byte *)((long)in_stack_fffffffffffffef0 + (ulong)(in_stack_fffffffffffffeec * 4 + 2))
                 = bVar21;
            *(char *)((long)in_stack_fffffffffffffef0 + (ulong)(in_stack_fffffffffffffeec * 4 + 3))
                 = cVar19;
          }
          in_RDI[5] = in_RDI[5] + 1;
          bVar10 = local_d8 <= (uint)in_RDI[5];
        }
        if ((((bVar2) && (bVar10)) && (bVar1)) && (bVar9)) break;
      }
    }
    if ((in_RDI[1] != 0) && (in_RDI[4] == 0)) {
      for (local_28 = 0; local_28 != sVar8; local_28 = local_28 + 1) {
        getPixelColorRGBA8((uchar *)CONCAT26(in_stack_ffffffffffffff16,
                                             CONCAT24(in_stack_ffffffffffffff14,
                                                      CONCAT22(in_stack_ffffffffffffff12,
                                                               in_stack_ffffffffffffff10))),
                           (uchar *)CONCAT44(in_stack_ffffffffffffff0c,
                                             CONCAT13(value,CONCAT12(bVar23,CONCAT11(bVar21,cVar19))
                                                     )),
                           (uchar *)CONCAT17(bVar18,CONCAT16(bVar17,CONCAT15(bVar16,CONCAT14(cVar15,
                                                  in_stack_ffffffffffffff00)))),
                           (uchar *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                           (uchar *)in_stack_fffffffffffffef0,
                           CONCAT44(in_stack_fffffffffffffeec,uVar14),in_stack_ffffffffffffff20);
        if (((cVar19 != '\0') && ((ushort)value == *(ushort *)(in_RDI + 2))) &&
           (((ushort)bVar23 == *(ushort *)((long)in_RDI + 10) &&
            ((ushort)bVar21 == *(ushort *)(in_RDI + 3))))) {
          in_RDI[4] = 1;
          in_RDI[1] = 0;
          if ((uint)in_RDI[0x106] < 8) {
            in_RDI[0x106] = 8;
          }
        }
      }
    }
    *(short *)(in_RDI + 2) = (short)in_RDI[2] + (short)in_RDI[2] * 0x100;
    *(short *)((long)in_RDI + 10) =
         *(short *)((long)in_RDI + 10) + *(short *)((long)in_RDI + 10) * 0x100;
    *(short *)(in_RDI + 3) = (short)in_RDI[3] + (short)in_RDI[3] * 0x100;
  }
LAB_001c425a:
  color_tree_cleanup((ColorTree *)
                     CONCAT17(in_stack_fffffffffffffed7,
                              CONCAT16(in_stack_fffffffffffffed6,
                                       CONCAT15(in_stack_fffffffffffffed5,
                                                CONCAT14(in_stack_fffffffffffffed4,
                                                         in_stack_fffffffffffffed0)))));
  return local_bc;
}

Assistant:

unsigned lodepng_compute_color_stats(LodePNGColorStats* stats,
                                     const unsigned char* in, unsigned w, unsigned h,
                                     const LodePNGColorMode* mode_in) {
  size_t i;
  ColorTree tree;
  size_t numpixels = (size_t)w * (size_t)h;
  unsigned error = 0;

  /* mark things as done already if it would be impossible to have a more expensive case */
  unsigned colored_done = lodepng_is_greyscale_type(mode_in) ? 1 : 0;
  unsigned alpha_done = lodepng_can_have_alpha(mode_in) ? 0 : 1;
  unsigned numcolors_done = 0;
  unsigned bpp = lodepng_get_bpp(mode_in);
  unsigned bits_done = (stats->bits == 1 && bpp == 1) ? 1 : 0;
  unsigned sixteen = 0; /* whether the input image is 16 bit */
  unsigned maxnumcolors = 257;
  if(bpp <= 8) maxnumcolors = LODEPNG_MIN(257, stats->numcolors + (1u << bpp));

  stats->numpixels += numpixels;

  /*if palette not allowed, no need to compute numcolors*/
  if(!stats->allow_palette) numcolors_done = 1;

  color_tree_init(&tree);

  /*If the stats was already filled in from previous data, fill its palette in tree
  and mark things as done already if we know they are the most expensive case already*/
  if(stats->alpha) alpha_done = 1;
  if(stats->colored) colored_done = 1;
  if(stats->bits == 16) numcolors_done = 1;
  if(stats->bits >= bpp) bits_done = 1;
  if(stats->numcolors >= maxnumcolors) numcolors_done = 1;

  if(!numcolors_done) {
    for(i = 0; i < stats->numcolors; i++) {
      const unsigned char* color = &stats->palette[i * 4];
      error = color_tree_add(&tree, color[0], color[1], color[2], color[3], (unsigned)i);
      if(error) goto cleanup;
    }
  }

  /*Check if the 16-bit input is truly 16-bit*/
  if(mode_in->bitdepth == 16 && !sixteen) {
    unsigned short r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i) {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
      if((r & 255) != ((r >> 8) & 255) || (g & 255) != ((g >> 8) & 255) ||
         (b & 255) != ((b >> 8) & 255) || (a & 255) != ((a >> 8) & 255)) /*first and second byte differ*/ {
        stats->bits = 16;
        sixteen = 1;
        bits_done = 1;
        numcolors_done = 1; /*counting colors no longer useful, palette doesn't support 16-bit*/
        break;
      }
    }
  }

  if(sixteen) {
    unsigned short r = 0, g = 0, b = 0, a = 0;

    for(i = 0; i != numpixels; ++i) {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);

      if(!colored_done && (r != g || r != b)) {
        stats->colored = 1;
        colored_done = 1;
      }

      if(!alpha_done) {
        unsigned matchkey = (r == stats->key_r && g == stats->key_g && b == stats->key_b);
        if(a != 65535 && (a != 0 || (stats->key && !matchkey))) {
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        } else if(a == 0 && !stats->alpha && !stats->key) {
          stats->key = 1;
          stats->key_r = r;
          stats->key_g = g;
          stats->key_b = b;
        } else if(a == 65535 && stats->key && matchkey) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        }
      }
      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(stats->key && !stats->alpha) {
      for(i = 0; i != numpixels; ++i) {
        getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
        if(a != 0 && r == stats->key_r && g == stats->key_g && b == stats->key_b) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        }
      }
    }
  } else /* < 16-bit */ {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    unsigned char pr = 0, pg = 0, pb = 0, pa = 0;
    for(i = 0; i != numpixels; ++i) {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);

      /*skip if color same as before, this speeds up large non-photographic
      images with many same colors by avoiding 'color_tree_has' below */
      if(i != 0 && r == pr && g == pg && b == pb && a == pa) continue;
      pr = r;
      pg = g;
      pb = b;
      pa = a;

      if(!bits_done && stats->bits < 8) {
        /*only r is checked, < 8 bits is only relevant for grayscale*/
        unsigned bits = getValueRequiredBits(r);
        if(bits > stats->bits) stats->bits = bits;
      }
      bits_done = (stats->bits >= bpp);

      if(!colored_done && (r != g || r != b)) {
        stats->colored = 1;
        colored_done = 1;
        if(stats->bits < 8) stats->bits = 8; /*PNG has no colored modes with less than 8-bit per channel*/
      }

      if(!alpha_done) {
        unsigned matchkey = (r == stats->key_r && g == stats->key_g && b == stats->key_b);
        if(a != 255 && (a != 0 || (stats->key && !matchkey))) {
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if(stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        } else if(a == 0 && !stats->alpha && !stats->key) {
          stats->key = 1;
          stats->key_r = r;
          stats->key_g = g;
          stats->key_b = b;
        } else if(a == 255 && stats->key && matchkey) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if(stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }

      if(!numcolors_done) {
        if(!color_tree_has(&tree, r, g, b, a)) {
          error = color_tree_add(&tree, r, g, b, a, stats->numcolors);
          if(error) goto cleanup;
          if(stats->numcolors < 256) {
            unsigned char* p = stats->palette;
            unsigned n = stats->numcolors;
            p[n * 4 + 0] = r;
            p[n * 4 + 1] = g;
            p[n * 4 + 2] = b;
            p[n * 4 + 3] = a;
          }
          ++stats->numcolors;
          numcolors_done = stats->numcolors >= maxnumcolors;
        }
      }

      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(stats->key && !stats->alpha) {
      for(i = 0; i != numpixels; ++i) {
        getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
        if(a != 0 && r == stats->key_r && g == stats->key_g && b == stats->key_b) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if(stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }
    }

    /*make the stats's key always 16-bit for consistency - repeat each byte twice*/
    stats->key_r += (stats->key_r << 8);
    stats->key_g += (stats->key_g << 8);
    stats->key_b += (stats->key_b << 8);
  }

cleanup:
  color_tree_cleanup(&tree);
  return error;
}